

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline_listener.c
# Opt level: O0

void ht_timeline_listener_container_unref(HT_TimelineListenerContainer *container)

{
  int iVar1;
  HT_TimelineListenerContainer *container_local;
  
  if (container != (HT_TimelineListenerContainer *)0x0) {
    iVar1 = container->refcount + -1;
    container->refcount = iVar1;
    if (iVar1 == 0) {
      ht_bag_deinit(&container->callbacks);
      ht_bag_deinit(&container->user_datas);
      ht_mutex_destroy(container->mutex);
      ht_free(container);
    }
    return;
  }
  __assert_fail("container",
                "/workspace/llm4binary/github/license_all_cmakelists_25/luisbg[P]hawktracer/lib/timeline_listener.c"
                ,0x1a,"void ht_timeline_listener_container_unref(HT_TimelineListenerContainer *)");
}

Assistant:

void
ht_timeline_listener_container_unref(HT_TimelineListenerContainer* container)
{
    assert(container);

    if (--container->refcount == 0)
    {
        ht_bag_deinit(&container->callbacks);
        ht_bag_deinit(&container->user_datas);
        ht_mutex_destroy(container->mutex);

        ht_free(container);
    }
}